

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O3

void __thiscall echo_server::on_new_connection(echo_server *this)

{
  __uniq_ptr_impl<echo_server::connection,_std::default_delete<echo_server::connection>_> _Var1;
  _Head_base<0UL,_echo_server::connection_*,_false> this_00;
  connection *pcc;
  __uniq_ptr_impl<echo_server::connection,_std::default_delete<echo_server::connection>_> local_20;
  _Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>
  local_18;
  
  this_00._M_head_impl = (connection *)operator_new(0x638);
  connection::connection(this_00._M_head_impl,this);
  local_20._M_t.
  super__Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>.
  super__Head_base<0UL,_echo_server::connection_*,_false>._M_head_impl =
       (tuple<echo_server::connection_*,_std::default_delete<echo_server::connection>_>)
       (tuple<echo_server::connection_*,_std::default_delete<echo_server::connection>_>)
       this_00._M_head_impl;
  local_18.super__Head_base<0UL,_echo_server::connection_*,_false>._M_head_impl =
       (_Head_base<0UL,_echo_server::connection_*,_false>)
       (_Head_base<0UL,_echo_server::connection_*,_false>)this_00._M_head_impl;
  std::
  _Rb_tree<echo_server::connection*,std::pair<echo_server::connection*const,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>,std::_Select1st<std::pair<echo_server::connection*const,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>>,std::less<echo_server::connection*>,std::allocator<std::pair<echo_server::connection*const,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>>>
  ::
  _M_emplace_unique<echo_server::connection*&,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>
            ((_Rb_tree<echo_server::connection*,std::pair<echo_server::connection*const,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>,std::_Select1st<std::pair<echo_server::connection*const,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>>,std::less<echo_server::connection*>,std::allocator<std::pair<echo_server::connection*const,std::unique_ptr<echo_server::connection,std::default_delete<echo_server::connection>>>>>
              *)&this->connections,(connection **)&local_18,
             (unique_ptr<echo_server::connection,_std::default_delete<echo_server::connection>_> *)
             &local_20);
  _Var1._M_t.
  super__Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>.
  super__Head_base<0UL,_echo_server::connection_*,_false>._M_head_impl =
       local_20._M_t.
       super__Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>
       .super__Head_base<0UL,_echo_server::connection_*,_false>._M_head_impl;
  if ((_Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>)
      local_20._M_t.
      super__Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>
      .super__Head_base<0UL,_echo_server::connection_*,_false>._M_head_impl != (connection *)0x0) {
    timer_element::~timer_element
              ((timer_element *)
               ((long)local_20._M_t.
                      super__Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>
                      .super__Head_base<0UL,_echo_server::connection_*,_false>._M_head_impl + 0x10))
    ;
    std::unique_ptr<client_socket::impl,_std::default_delete<client_socket::impl>_>::~unique_ptr
              ((unique_ptr<client_socket::impl,_std::default_delete<client_socket::impl>_> *)
               ((long)_Var1._M_t.
                      super__Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>
                      .super__Head_base<0UL,_echo_server::connection_*,_false>._M_head_impl + 8));
    operator_delete((void *)_Var1._M_t.
                            super__Tuple_impl<0UL,_echo_server::connection_*,_std::default_delete<echo_server::connection>_>
                            .super__Head_base<0UL,_echo_server::connection_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void echo_server::on_new_connection()
{
    std::unique_ptr<connection> cc(new connection(this));
    connection* pcc = cc.get();
    connections.emplace(pcc, std::move(cc));
}